

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_greedy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  BYTE *pBVar3;
  seqDef *psVar4;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  BYTE *pBVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  uint uVar21;
  U32 UVar22;
  U32 UVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  U32 UVar28;
  int *piVar29;
  int *piVar30;
  int *iend;
  U32 UVar31;
  size_t ofbCandidate;
  U32 maxDistance;
  size_t local_a0;
  uint local_98;
  int local_94;
  uint local_90;
  uint local_8c;
  BYTE *local_88;
  ulong local_80;
  BYTE *local_78;
  int *local_70;
  BYTE *local_68;
  BYTE *local_60;
  BYTE *local_58;
  int *local_50;
  U32 *local_48;
  ulong local_40;
  int *local_38;
  
  pBVar3 = (ms->window).base;
  pBVar16 = (ms->window).dictBase;
  uVar14 = (ms->window).dictLimit;
  uVar11 = (ulong)uVar14;
  local_8c = (ms->cParams).minMatch;
  if (5 < local_8c) {
    local_8c = 6;
  }
  if (local_8c < 5) {
    local_8c = 4;
  }
  local_90 = (ms->cParams).searchLog;
  uVar27 = 6;
  if (local_90 < 6) {
    uVar27 = local_90;
  }
  uVar15 = (ms->window).lowLimit;
  if (uVar27 < 5) {
    uVar27 = 4;
  }
  uVar21 = (ms->cParams).windowLog;
  UVar28 = *rep;
  UVar22 = rep[1];
  ms->lazySkipping = 0;
  local_68 = pBVar3 + uVar11;
  piVar30 = (int *)((ulong)(local_68 == (BYTE *)src) + (long)src);
  local_70 = (int *)((long)src + (srcSize - 0x10));
  uVar2 = ms->nextToUpdate;
  uVar24 = (ulong)uVar2;
  uVar26 = ((int)local_70 - (int)(pBVar3 + uVar24)) + 1;
  uVar13 = 8;
  if (uVar26 < 8) {
    uVar13 = uVar26;
  }
  if (local_70 < pBVar3 + uVar24) {
    uVar13 = 0;
  }
  if (uVar2 < uVar13 + uVar2) {
    uVar25 = ms->hashSalt;
    cVar5 = (char)ms->rowHashLog;
    do {
      if (local_8c == 5) {
        uVar9 = *(long *)(pBVar3 + uVar24) * -0x30e4432345000000;
LAB_01d76bd6:
        uVar26 = (uint)((uVar9 ^ uVar25) >> (0x38U - cVar5 & 0x3f));
      }
      else {
        if (local_8c == 6) {
          uVar9 = *(long *)(pBVar3 + uVar24) * -0x30e4432340650000;
          goto LAB_01d76bd6;
        }
        uVar26 = (*(int *)(pBVar3 + uVar24) * -0x61c8864f ^ (uint)uVar25) >> (0x18U - cVar5 & 0x1f);
      }
      ms->hashCache[(uint)uVar24 & 7] = uVar26;
      uVar24 = uVar24 + 1;
    } while (uVar13 + uVar2 != uVar24);
  }
  local_88 = (BYTE *)(srcSize + (long)src);
  local_48 = rep;
  if (piVar30 < local_70) {
    uVar21 = 1 << ((byte)uVar21 & 0x1f);
    local_58 = pBVar16 + uVar11;
    local_60 = pBVar16 + uVar15;
    local_94 = uVar14 - 1;
    local_50 = (int *)(local_88 + -0x20);
    local_98 = uVar21;
    local_80 = uVar11;
    local_78 = pBVar16;
    do {
      iVar8 = ((int)piVar30 - (int)pBVar3) + 1;
      UVar31 = (ms->window).lowLimit;
      UVar23 = iVar8 - uVar21;
      if (iVar8 - UVar31 <= uVar21) {
        UVar23 = UVar31;
      }
      if (ms->loadedDictEnd != 0) {
        UVar23 = UVar31;
      }
      uVar14 = iVar8 - UVar28;
      pBVar17 = pBVar3;
      if (uVar14 < (uint)uVar11) {
        pBVar17 = pBVar16;
      }
      iend = (int *)((long)piVar30 + 1);
      if (local_94 - uVar14 < 3) {
LAB_01d76d4a:
        iVar18 = 0;
        uVar24 = 0;
      }
      else {
        iVar18 = 0;
        uVar24 = 0;
        if (UVar28 <= iVar8 - UVar23) {
          if (*iend != *(int *)(pBVar17 + uVar14)) goto LAB_01d76d4a;
          pBVar16 = local_88;
          if (uVar14 < (uint)uVar11) {
            pBVar16 = local_58;
          }
          sVar10 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar30 + 5),(BYTE *)((long)(pBVar17 + uVar14) + 4),
                              local_88,pBVar16,local_68);
          uVar24 = sVar10 + 4;
          iVar18 = 6;
          pBVar16 = local_78;
          uVar11 = local_80;
        }
      }
      UVar31 = UVar28;
      if (iVar18 == 6) {
        uVar25 = 1;
LAB_01d76db7:
        uVar9 = (long)iend - (long)src;
        if (local_50 < iend) {
          local_40 = uVar25;
          ZSTD_safecopyLiterals(seqStore->lit,(BYTE *)src,(BYTE *)iend,(BYTE *)local_50);
          uVar25 = local_40;
          pBVar16 = local_78;
          uVar11 = local_80;
        }
        else {
          pBVar17 = seqStore->lit;
          uVar6 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar17 = *src;
          *(undefined8 *)(pBVar17 + 8) = uVar6;
          if (0x10 < uVar9) {
            pBVar17 = seqStore->lit;
            uVar6 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar17 + 0x18) = uVar6;
            if (0x20 < (long)uVar9) {
              lVar19 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar19 + 0x20);
                uVar6 = puVar1[1];
                pBVar12 = pBVar17 + lVar19 + 0x20;
                *(undefined8 *)pBVar12 = *puVar1;
                *(undefined8 *)(pBVar12 + 8) = uVar6;
                puVar1 = (undefined8 *)((long)src + lVar19 + 0x30);
                uVar6 = puVar1[1];
                *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar12 + 0x18) = uVar6;
                lVar19 = lVar19 + 0x20;
              } while (pBVar12 + 0x20 < pBVar17 + uVar9);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar9;
        if (0xffff < uVar9) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4 = seqStore->sequences;
        psVar4->litLength = (U16)uVar9;
        psVar4->offBase = (U32)uVar25;
        if (0xffff < uVar24 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar4->mlBase = (U16)(uVar24 - 3);
        seqStore->sequences = psVar4 + 1;
        if (ms->lazySkipping != 0) {
          uVar14 = ms->nextToUpdate;
          uVar11 = (ulong)uVar14;
          uVar15 = ((int)local_70 - (int)(pBVar3 + uVar11)) + 1;
          if (7 < uVar15) {
            uVar15 = 8;
          }
          if (local_70 < pBVar3 + uVar11) {
            uVar15 = 0;
          }
          if (uVar14 < uVar15 + uVar14) {
            uVar25 = ms->hashSalt;
            cVar5 = (char)ms->rowHashLog;
            do {
              if (local_8c == 5) {
                uVar9 = *(long *)(pBVar3 + uVar11) * -0x30e4432345000000;
LAB_01d76f67:
                UVar28 = (U32)((uVar9 ^ uVar25) >> (0x38U - cVar5 & 0x3f));
              }
              else {
                if (local_8c == 6) {
                  uVar9 = *(long *)(pBVar3 + uVar11) * -0x30e4432340650000;
                  goto LAB_01d76f67;
                }
                UVar28 = (*(int *)(pBVar3 + uVar11) * -0x61c8864f ^ (uint)uVar25) >>
                         (0x18U - cVar5 & 0x1f);
              }
              ms->hashCache[(uint)uVar11 & 7] = UVar28;
              uVar11 = uVar11 + 1;
            } while (uVar15 + uVar14 != uVar11);
          }
          ms->lazySkipping = 0;
          pBVar16 = local_78;
          uVar11 = local_80;
        }
        piVar30 = (int *)((long)iend + uVar24);
        piVar29 = local_70;
        src = piVar30;
        uVar21 = local_98;
        do {
          UVar28 = UVar31;
          if (piVar29 < piVar30) break;
          iVar8 = (int)piVar30 - (int)pBVar3;
          UVar28 = (ms->window).lowLimit;
          UVar23 = iVar8 - uVar21;
          if (iVar8 - UVar28 <= uVar21) {
            UVar23 = UVar28;
          }
          if (ms->loadedDictEnd != 0) {
            UVar23 = UVar28;
          }
          uVar14 = iVar8 - UVar22;
          pBVar17 = pBVar3;
          if (uVar14 < (uint)uVar11) {
            pBVar17 = pBVar16;
          }
          if (((local_94 - uVar14 < 3) || (iVar8 - UVar23 < UVar22)) ||
             (*piVar30 != *(int *)(pBVar17 + uVar14))) {
            bVar7 = false;
            uVar14 = UVar31;
          }
          else {
            pBVar16 = local_88;
            if (uVar14 < (uint)uVar11) {
              pBVar16 = local_58;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar30 + 1),(BYTE *)((long)(pBVar17 + uVar14) + 4),
                                local_88,pBVar16,local_68);
            pBVar16 = seqStore->lit;
            if (local_50 < src) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)src,(BYTE *)src,(BYTE *)local_50);
            }
            else {
              uVar6 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar16 = *src;
              *(undefined8 *)(pBVar16 + 8) = uVar6;
            }
            psVar4 = seqStore->sequences;
            psVar4->litLength = 0;
            psVar4->offBase = 1;
            if (0xffff < sVar10 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar4->mlBase = (U16)(sVar10 + 1);
            seqStore->sequences = psVar4 + 1;
            piVar30 = (int *)((long)piVar30 + sVar10 + 4);
            bVar7 = true;
            pBVar16 = local_78;
            uVar11 = local_80;
            piVar29 = local_70;
            src = piVar30;
            uVar14 = UVar22;
            uVar21 = local_98;
            UVar22 = UVar31;
          }
          UVar31 = uVar14;
          UVar28 = UVar31;
        } while (bVar7);
      }
      else {
        piVar29 = local_70;
        uVar21 = local_98;
        if (iVar18 == 0) {
          local_a0 = 999999999;
          local_38 = (int *)src;
          if (local_8c == 6) {
            if (uVar27 == 6) {
              uVar11 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)piVar30,local_88,&local_a0);
            }
            else if (uVar27 == 5) {
              uVar11 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)piVar30,local_88,&local_a0);
            }
            else {
              uVar11 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)piVar30,local_88,&local_a0);
            }
          }
          else if (local_8c == 5) {
            if (uVar27 == 6) {
              uVar11 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)piVar30,local_88,&local_a0);
            }
            else if (uVar27 == 5) {
              uVar11 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)piVar30,local_88,&local_a0);
            }
            else {
              uVar11 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)piVar30,local_88,&local_a0);
            }
          }
          else if (uVar27 == 6) {
            uVar11 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)piVar30,local_88,&local_a0);
          }
          else if (uVar27 == 5) {
            uVar11 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)piVar30,local_88,&local_a0);
          }
          else {
            uVar11 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)piVar30,local_88,&local_a0);
          }
          uVar25 = local_a0;
          piVar29 = piVar30;
          if (uVar11 <= uVar24) {
            uVar11 = uVar24;
            uVar25 = 1;
            piVar29 = iend;
          }
          iend = piVar29;
          uVar24 = uVar11;
          pBVar16 = local_78;
          uVar11 = local_80;
          src = local_38;
          if (3 < uVar24) {
            if (3 < uVar25) {
              pcVar20 = (char *)((long)iend + (3 - (long)(pBVar3 + uVar25)));
              pBVar12 = local_68;
              pBVar17 = pBVar3;
              if ((uint)pcVar20 < (uint)local_80) {
                pBVar12 = local_60;
                pBVar17 = local_78;
              }
              if ((local_38 < iend) &&
                 (uVar9 = (ulong)pcVar20 & 0xffffffff, pBVar12 < pBVar17 + uVar9)) {
                pBVar17 = pBVar17 + uVar9;
                do {
                  piVar30 = (int *)((long)iend + -1);
                  pBVar17 = pBVar17 + -1;
                  if ((*(BYTE *)piVar30 != *pBVar17) ||
                     (uVar24 = uVar24 + 1, iend = piVar30, piVar30 <= local_38)) break;
                } while (pBVar12 < pBVar17);
              }
              UVar31 = (int)uVar25 - 3;
              UVar22 = UVar28;
            }
            goto LAB_01d76db7;
          }
          uVar24 = (long)piVar30 - (long)local_38;
          piVar30 = (int *)((long)piVar30 + (uVar24 >> 8) + 1);
          ms->lazySkipping = (uint)(0x8ff < uVar24);
          piVar29 = local_70;
          uVar21 = local_98;
        }
      }
    } while (piVar30 < piVar29);
  }
  *local_48 = UVar28;
  local_48[1] = UVar22;
  return (long)local_88 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0);
}